

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PrimRect(ImDrawList *this,ImVec2 *a,ImVec2 *c,ImU32 col)

{
  undefined8 uVar1;
  short sVar2;
  undefined4 in_ECX;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  ImDrawIdx idx;
  ImVec2 uv;
  ImVec2 d;
  ImVec2 b;
  ImVec2 local_2c;
  ImVec2 local_24;
  undefined4 local_1c;
  float *local_18;
  float *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ImVec2::ImVec2(&local_24,*in_RDX,in_RSI[1]);
  ImVec2::ImVec2(&local_2c,*local_10,local_18[1]);
  uVar1 = **(undefined8 **)(in_RDI + 0x38);
  sVar2 = (short)*(undefined4 *)(in_RDI + 0x34);
  **(short **)(in_RDI + 0x50) = sVar2;
  *(short *)(*(long *)(in_RDI + 0x50) + 2) = sVar2 + 1;
  *(short *)(*(long *)(in_RDI + 0x50) + 4) = sVar2 + 2;
  *(short *)(*(long *)(in_RDI + 0x50) + 6) = sVar2;
  *(short *)(*(long *)(in_RDI + 0x50) + 8) = sVar2 + 2;
  *(short *)(*(long *)(in_RDI + 0x50) + 10) = sVar2 + 3;
  **(undefined8 **)(in_RDI + 0x48) = *(undefined8 *)local_10;
  *(undefined8 *)(*(long *)(in_RDI + 0x48) + 8) = uVar1;
  *(undefined4 *)(*(long *)(in_RDI + 0x48) + 0x10) = local_1c;
  *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x14) = local_24;
  *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x1c) = uVar1;
  *(undefined4 *)(*(long *)(in_RDI + 0x48) + 0x24) = local_1c;
  *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x28) = *(undefined8 *)local_18;
  *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x30) = uVar1;
  *(undefined4 *)(*(long *)(in_RDI + 0x48) + 0x38) = local_1c;
  *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x3c) = local_2c;
  *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x44) = uVar1;
  *(undefined4 *)(*(long *)(in_RDI + 0x48) + 0x4c) = local_1c;
  *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 0x50;
  *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 4;
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 0xc;
  return;
}

Assistant:

void ImDrawList::PrimRect(const ImVec2& a, const ImVec2& c, ImU32 col)
{
    ImVec2 b(c.x, a.y), d(a.x, c.y), uv(_Data->TexUvWhitePixel);
    ImDrawIdx idx = (ImDrawIdx)_VtxCurrentIdx;
    _IdxWritePtr[0] = idx; _IdxWritePtr[1] = (ImDrawIdx)(idx+1); _IdxWritePtr[2] = (ImDrawIdx)(idx+2);
    _IdxWritePtr[3] = idx; _IdxWritePtr[4] = (ImDrawIdx)(idx+2); _IdxWritePtr[5] = (ImDrawIdx)(idx+3);
    _VtxWritePtr[0].pos = a; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
    _VtxWritePtr[1].pos = b; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
    _VtxWritePtr[2].pos = c; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
    _VtxWritePtr[3].pos = d; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
    _VtxWritePtr += 4;
    _VtxCurrentIdx += 4;
    _IdxWritePtr += 6;
}